

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_FileEnumerator.cpp
# Opt level: O2

String * __thiscall
axl::io::FileEnumerator::getNextFileName(String *__return_storage_ptr__,FileEnumerator *this)

{
  String *src;
  int iVar1;
  dirent *dirEntryPtr;
  dirent dirEntry;
  dirent *local_138;
  dirent local_130;
  
  if ((this->super_FileEnumeratorHandle).m_h == (__dirstream *)0x0) {
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).
             m_hdr + 1) = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).
             m_length + 1) = 0;
    (__return_storage_ptr__->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_p =
         (C *)0x0;
    (__return_storage_ptr__->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_hdr =
         (BufHdr *)0x0;
  }
  else {
    src = &this->m_nextFileName;
    sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::StringBase(__return_storage_ptr__,src);
    iVar1 = readdir_r((DIR *)(this->super_FileEnumeratorHandle).m_h,&local_130,&local_138);
    if (local_138 == (dirent *)0x0 || iVar1 != 0) {
      sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::clear(src);
    }
    else {
      sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::operator=(src,local_138->d_name);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

sl::String
FileEnumerator::getNextFileName() {
	if (!isOpen())
		return sl::String();

	sl::String fileName = m_nextFileName;

	dirent dirEntry;
	dirent* dirEntryPtr;
	int result = readdir_r(m_h, &dirEntry, &dirEntryPtr);

	if (result == 0 && dirEntryPtr)
		m_nextFileName = dirEntryPtr->d_name;
	else
		m_nextFileName.clear();

	return fileName;
}